

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O1

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getShaderFlagStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkShaderStageFlagBits shader,
          bool isDescription)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char cVar4;
  char *pcVar5;
  ostringstream desc;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar3 = 0x15;
  pcVar5 = "unknown shader stage!";
  iVar1 = (int)this;
  cVar4 = (char)shader;
  switch(iVar1) {
  case 1:
    pcVar5 = "vertex_stage";
    if (cVar4 != '\0') {
      pcVar5 = "vertex stage";
    }
    lVar3 = 0xc;
    break;
  case 2:
    pcVar5 = "tessellation_control_stage";
    if (cVar4 != '\0') {
      pcVar5 = "tessellation control stage";
    }
    lVar3 = 0x1a;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    pcVar5 = "tessellation_evaluation_stage";
    if (cVar4 != '\0') {
      pcVar5 = "tessellation evaluation stage";
    }
    lVar3 = 0x1d;
    break;
  case 8:
    pcVar2 = "geometry stage";
    pcVar5 = "geometry_stage";
    goto LAB_0047b8be;
  default:
    if (iVar1 != 0x10) {
      if (iVar1 == 0x20) {
        pcVar5 = "compute_stage";
        if (cVar4 != '\0') {
          pcVar5 = "compute stage";
        }
        lVar3 = 0xd;
      }
      break;
    }
    pcVar2 = "fragment stage";
    pcVar5 = "fragment_stage";
LAB_0047b8be:
    if (cVar4 != '\0') {
      pcVar5 = pcVar2;
    }
    lVar3 = 0xe;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar5,lVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderFlagStr (const VkShaderStageFlagBits shader,
							  bool                        isDescription)
{
	std::ostringstream desc;
	switch(shader)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:
		{
			desc << ((isDescription) ? "vertex stage" : "vertex_stage");
			break;
		}
		case VK_SHADER_STAGE_FRAGMENT_BIT:
		{
			desc << ((isDescription) ? "fragment stage" : "fragment_stage");
			break;
		}
		case VK_SHADER_STAGE_GEOMETRY_BIT:
		{
			desc << ((isDescription) ? "geometry stage" : "geometry_stage");
			break;
		}
		case VK_SHADER_STAGE_COMPUTE_BIT:
		{
			desc << ((isDescription) ? "compute stage" : "compute_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		{
			desc << ((isDescription) ? "tessellation control stage" : "tessellation_control_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		{
			desc << ((isDescription) ? "tessellation evaluation stage" : "tessellation_evaluation_stage");
			break;
		}
	  default:
		desc << "unknown shader stage!";
		DE_FATAL("Unknown shader Stage!");
		break;
	};

	return desc.str();
}